

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Performance::anon_unknown_1::
BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>::
BasicBufferCase(BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                *this,Context *context,char *name,char *desc,int bufferSizeMin,int bufferSizeMax,
               int numSamples,int flags)

{
  undefined8 *puVar1;
  bool bVar2;
  uint uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  deUint64 dVar6;
  uint uVar7;
  pointer pUVar8;
  pointer pUVar9;
  uint uVar10;
  _Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
  *__n;
  int iVar11;
  _Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
  *this_00;
  long lVar12;
  float fVar13;
  allocator_type local_41;
  vector<int,_std::allocator<int>_> *local_40;
  float local_38;
  float local_34;
  
  gles3::TestCase::TestCase(&this->super_TestCase,context,NODETYPE_PERFORMANCE,name,desc);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BasicBufferCase_01e4a058;
  this->m_dummyProgram = (ShaderProgram *)0x0;
  this->m_dummyProgramPosLoc = -1;
  this->m_bufferID = 0;
  this->m_numSamples = numSamples;
  this->m_bufferSizeMin = bufferSizeMin;
  this->m_bufferSizeMax = bufferSizeMax;
  this->m_allocateLargerBuffer = (bool)((byte)flags & 1);
  this->m_iteration = 0;
  local_40 = &this->m_iterationOrder;
  this_00 = (_Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
             *)(long)numSamples;
  __n = this_00;
  std::vector<int,_std::allocator<int>_>::vector(local_40,(size_type)this_00,&local_41);
  if (-1 < numSamples) {
    (this->m_results).
    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this->m_results).
    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->m_results).
    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pUVar8 = std::
             _Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
             ::_M_allocate(this_00,(size_t)__n);
    (this->m_results).
    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
    ._M_impl.super__Vector_impl_data._M_start = pUVar8;
    (this->m_results).
    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pUVar8 + (long)this_00;
    pUVar9 = pUVar8;
    if (numSamples != 0) {
      (pUVar8->duration).totalDuration = 0;
      (pUVar8->duration).fitResponseDuration = 0;
      pUVar8->bufferSize = 0;
      pUVar8->allocatedSize = 0;
      *(undefined8 *)&pUVar8->writtenSize = 0;
      if (numSamples == 1) {
        pUVar9 = pUVar8 + 1;
      }
      else {
        for (lVar12 = 0x20; pUVar9 = pUVar8 + (long)this_00, (long)this_00 * 0x20 != lVar12;
            lVar12 = lVar12 + 0x20) {
          puVar1 = (undefined8 *)((long)&pUVar8->bufferSize + lVar12);
          uVar4 = *(undefined8 *)pUVar8;
          uVar5 = *(undefined8 *)&pUVar8->writtenSize;
          dVar6 = (pUVar8->duration).fitResponseDuration;
          puVar1[2] = (pUVar8->duration).totalDuration;
          puVar1[3] = dVar6;
          *puVar1 = uVar4;
          puVar1[1] = uVar5;
        }
      }
    }
    (this->m_results).
    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pUVar9;
    this->m_useGL = true;
    this->m_bufferRandomizerTimer = 0;
    generateTwoPassRandomIterationOrder(local_40,this->m_numSamples);
    uVar3 = this->m_numSamples;
    local_40 = (vector<int,_std::allocator<int>_> *)CONCAT44(local_40._4_4_,(float)bufferSizeMin);
    local_34 = (float)(bufferSizeMax - bufferSizeMin);
    local_38 = (float)(int)uVar3;
    bVar2 = this->m_allocateLargerBuffer;
    lVar12 = 0;
    if ((int)uVar3 < 1) {
      uVar3 = 0;
    }
    pUVar9 = (this->m_results).
             super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar11 = 1;
    for (; (ulong)uVar3 * 0x20 != lVar12; lVar12 = lVar12 + 0x20) {
      fVar13 = floorf(((float)iVar11 / local_38) * local_34 + local_40._0_4_);
      uVar7 = (int)fVar13 + 0xfU & 0xfffffff0;
      uVar10 = (int)((float)(int)uVar7 * 1.5);
      if ((bVar2 & 1U) == 0) {
        uVar10 = uVar7;
      }
      *(uint *)((long)&pUVar9->bufferSize + lVar12) = uVar7;
      *(uint *)((long)&pUVar9->allocatedSize + lVar12) = uVar10 + 0xf & 0xfffffff0;
      *(undefined4 *)((long)&pUVar9->writtenSize + lVar12) = 0xffffffff;
      iVar11 = iVar11 + 1;
    }
    return;
  }
  std::__throw_length_error("cannot create std::vector larger than max_size()");
}

Assistant:

BasicBufferCase<SampleType>::BasicBufferCase (Context& context, const char* name, const char* desc, int bufferSizeMin, int bufferSizeMax, int numSamples, int flags)
	: TestCase					(context, tcu::NODETYPE_PERFORMANCE, name, desc)
	, m_dummyProgram			(DE_NULL)
	, m_dummyProgramPosLoc		(-1)
	, m_bufferID				(0)
	, m_numSamples				(numSamples)
	, m_bufferSizeMin			(bufferSizeMin)
	, m_bufferSizeMax			(bufferSizeMax)
	, m_allocateLargerBuffer	((flags & FLAG_ALLOCATE_LARGER_BUFFER) != 0)
	, m_iteration				(0)
	, m_iterationOrder			(numSamples)
	, m_results					(numSamples)
	, m_useGL					(true)
	, m_bufferRandomizerTimer	(0)
{
	// "randomize" iteration order. Deterministic, patternless
	generateTwoPassRandomIterationOrder(m_iterationOrder, m_numSamples);

	// choose buffer sizes
	for (int sampleNdx = 0; sampleNdx < m_numSamples; ++sampleNdx)
	{
		const int rawBufferSize			= (int)deFloatFloor((float)bufferSizeMin + (float)(bufferSizeMax - bufferSizeMin) * ((float)(sampleNdx + 1) / (float)m_numSamples));
		const int bufferSize			= deAlign32(rawBufferSize, 16);
		const int allocatedBufferSize	= deAlign32((m_allocateLargerBuffer) ? ((int)((float)bufferSize * 1.5f)) : (bufferSize), 16);

		m_results[sampleNdx].bufferSize		= bufferSize;
		m_results[sampleNdx].allocatedSize	= allocatedBufferSize;
		m_results[sampleNdx].writtenSize	= -1;
	}
}